

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQTable * CreateDefaultDelegate(SQSharedState *ss,SQRegFunction *funcz)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQTable *this;
  SQObjectValue SVar3;
  SQString *x;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  this = SQTable::Create(ss,0);
  while( true ) {
    if (funcz->name == (SQChar *)0x0) {
      return this;
    }
    SVar3.pNativeClosure = SQNativeClosure::Create(ss,funcz->f,0);
    ((SVar3.pTable)->super_SQDelegable)._delegate = (SQTable *)funcz->nparamscheck;
    x = SQString::Create(ss,funcz->name,-1);
    SQObjectPtr::operator=(&(SVar3.pNativeClosure)->_name,x);
    if ((funcz->typemask != (SQChar *)0x0) &&
       (bVar2 = CompileTypemask(&(SVar3.pNativeClosure)->_typecheck,funcz->typemask), !bVar2))
    break;
    local_40.super_SQObject._unVal.pString = SQString::Create(ss,funcz->name,-1);
    local_40.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_50.super_SQObject._type = OT_NATIVECLOSURE;
    pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_50.super_SQObject._unVal.pNativeClosure = SVar3.pNativeClosure;
    SQTable::NewSlot(this,&local_40,&local_50);
    SQObjectPtr::~SQObjectPtr(&local_50);
    SQObjectPtr::~SQObjectPtr(&local_40);
    funcz = funcz + 1;
  }
  return (SQTable *)0x0;
}

Assistant:

SQTable *CreateDefaultDelegate(SQSharedState *ss,const SQRegFunction *funcz)
{
    SQInteger i=0;
    SQTable *t=SQTable::Create(ss,0);
    while(funcz[i].name!=0){
        SQNativeClosure *nc = SQNativeClosure::Create(ss,funcz[i].f,0);
        nc->_nparamscheck = funcz[i].nparamscheck;
        nc->_name = SQString::Create(ss,funcz[i].name);
        if(funcz[i].typemask && !CompileTypemask(nc->_typecheck,funcz[i].typemask))
            return NULL;
        t->NewSlot(SQString::Create(ss,funcz[i].name),nc);
        i++;
    }
    return t;
}